

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int struct_size_IOfield(FMContext fmc,FMFieldList list)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  long elements;
  int field_size;
  int struct_size;
  int i;
  long *in_stack_00000400;
  char *in_stack_00000408;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  while (*(long *)(in_RSI + (long)local_14 * 0x18) != 0) {
    iVar1 = is_var_array_field((FMFieldList)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
    if (iVar1 == 1) {
      if ((in_RDI == 0) || (*(int *)(in_RDI + 0xc) == 0)) {
        local_1c = 8;
      }
      else {
        local_1c = *(int *)(in_RDI + 0xc);
      }
    }
    else if (in_RDI == 0) {
      local_1c = *(int *)(in_RSI + (long)local_14 * 0x18 + 0x10);
    }
    else {
      FMarray_str_to_data_type(in_stack_00000408,in_stack_00000400);
      local_1c = *(int *)(in_RSI + (long)local_14 * 0x18 + 0x10) * local_28;
    }
    if (local_18 < *(int *)(in_RSI + (long)local_14 * 0x18 + 0x14) + local_1c) {
      local_18 = *(int *)(in_RSI + (long)local_14 * 0x18 + 0x14) + local_1c;
    }
    local_14 = local_14 + 1;
    in_stack_ffffffffffffffd4 = local_18;
  }
  return local_18;
}

Assistant:

extern
int
struct_size_IOfield(FMContext fmc, FMFieldList list)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    if ((fmc == NULL) || (fmc->native_pointer_size == 0)) {
		field_size = sizeof(char *);
	    } else {
		field_size = fmc->native_pointer_size;
	    }
	} else {
	    if (fmc) {
		long elements;
		FMarray_str_to_data_type(list[i].field_type, &elements);
		field_size = list[i].field_size * elements;
	    } else {
		field_size = list[i].field_size;
	    }
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
	i++;
    }
    return struct_size;
}